

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

Connection
QObject::connectImpl
          (QObject *sender,void **signal,QObject *receiver,void **slot,QSlotObjectBase *slotObjRaw,
          ConnectionType type,int *types,QMetaObject *senderMetaObject)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  long in_RDX;
  undefined8 *in_RSI;
  Connection *in_RDI;
  long in_FS_OFFSET;
  QMetaObject *in_stack_00000018;
  int signal_index;
  SlotObjUniquePtr slotObj;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category_1;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  void *args [2];
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_fffffffffffffe70;
  QMetaObject *in_stack_fffffffffffffe78;
  QMessageLogger *in_stack_fffffffffffffe80;
  QMessageLogger local_70;
  undefined1 *local_50;
  undefined1 *local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  std::unique_ptr<QtPrivate::QSlotObjectBase,QtPrivate::QSlotObjectBase::Deleter>::
  unique_ptr<QtPrivate::QSlotObjectBase::Deleter,void>
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe70,
             (pointer)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (in_RDX == 0) {
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffe70,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&stack0xffffffffffffffc8), bVar2) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f94d4);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (char *)0x3f94fa);
      QMessageLogger::warning(&local_70,"QObject::connect: invalid nullptr parameter");
    }
    QMetaObject::Connection::Connection(in_RDI);
  }
  else {
    while (in_stack_00000018 != (QMetaObject *)0x0) {
      QMetaObject::static_metacall
                (in_stack_fffffffffffffe78,(Call)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (int)in_stack_fffffffffffffe70,
                 (void **)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      in_stack_00000018 = QMetaObject::superClass((QMetaObject *)0x3f965a);
    }
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    lcConnect();
    anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              (in_stack_fffffffffffffe70,
               (QLoggingCategory *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_48), bVar2) {
      anon_unknown.dwarf_6d7bd1::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x3f96e0);
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffe80,(char *)in_stack_fffffffffffffe78,
                 (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                 (char *)0x3f9700);
      (**(code **)*in_RSI)();
      pcVar3 = QMetaObject::className
                         ((QMetaObject *)
                          CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xffffffffffffff68,
                 "QObject::connect: signal not found in %s",pcVar3);
    }
    QMetaObject::Connection::Connection(in_RDI,(void *)0x0);
  }
  std::unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter>::~unique_ptr
            ((unique_ptr<QtPrivate::QSlotObjectBase,_QtPrivate::QSlotObjectBase::Deleter> *)
             in_stack_fffffffffffffe70);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Connection)in_RDI;
}

Assistant:

QMetaObject::Connection QObject::connectImpl(const QObject *sender, void **signal,
                                             const QObject *receiver, void **slot,
                                             QtPrivate::QSlotObjectBase *slotObjRaw, Qt::ConnectionType type,
                                             const int *types, const QMetaObject *senderMetaObject)
{
    QtPrivate::SlotObjUniquePtr slotObj(slotObjRaw);
    if (!signal) {
        qCWarning(lcConnect, "QObject::connect: invalid nullptr parameter");
        return QMetaObject::Connection();
    }

    int signal_index = -1;
    void *args[] = { &signal_index, signal };
    for (; senderMetaObject && signal_index < 0; senderMetaObject = senderMetaObject->superClass()) {
        senderMetaObject->static_metacall(QMetaObject::IndexOfMethod, 0, args);
        if (signal_index >= 0 && signal_index < QMetaObjectPrivate::get(senderMetaObject)->signalCount)
            break;
    }
    if (!senderMetaObject) {
        qCWarning(lcConnect, "QObject::connect: signal not found in %s", sender->metaObject()->className());
        return QMetaObject::Connection(nullptr);
    }
    signal_index += QMetaObjectPrivate::signalOffset(senderMetaObject);
    return QObjectPrivate::connectImpl(sender, signal_index, receiver, slot, slotObj.release(), type, types, senderMetaObject);
}